

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_prefix(lys_module *module,lys_import *imp,char *value)

{
  int iVar1;
  int local_2c;
  int ret;
  char *value_local;
  lys_import *imp_local;
  lys_module *module_local;
  
  if ((imp == (lys_import *)0x0) &&
     (iVar1 = lyp_check_identifier(module->ctx,value,LY_IDENT_PREFIX,module,(lys_node *)0x0),
     iVar1 != 0)) {
    free(value);
    return 1;
  }
  if (imp == (lys_import *)0x0) {
    local_2c = yang_check_string(module,&module->prefix,"prefix","module",value,(lys_node *)0x0);
  }
  else {
    local_2c = yang_check_string(module,&imp->prefix,"prefix","import",value,(lys_node *)0x0);
  }
  return local_2c;
}

Assistant:

int
yang_read_prefix(struct lys_module *module, struct lys_import *imp, char *value)
{
    int ret = 0;

    if (!imp && lyp_check_identifier(module->ctx, value, LY_IDENT_PREFIX, module, NULL)) {
        free(value);
        return EXIT_FAILURE;
    }

    if (imp) {
        ret = yang_check_string(module, &imp->prefix, "prefix", "import", value, NULL);
    } else {
        ret = yang_check_string(module, &module->prefix, "prefix", "module", value, NULL);
    }

    return ret;
}